

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# test_compact_optional.cpp
# Opt level: O0

void test_evp_enum(void)

{
  bool bVar1;
  reference_type pDVar2;
  storage_type *psVar3;
  value_type local_2c;
  compact_optional<ak_toolbox::compact_optional_ns::evp_enum<Dir,__1>,_ak_toolbox::compact_optional_ns::default_tag>
  local_28 [2];
  opt_dir oW;
  value_type local_14;
  compact_optional<ak_toolbox::compact_optional_ns::evp_enum<Dir,__1>,_ak_toolbox::compact_optional_ns::default_tag>
  local_10;
  compact_optional<ak_toolbox::compact_optional_ns::evp_enum<Dir,__1>,_ak_toolbox::compact_optional_ns::default_tag>
  local_c;
  opt_dir oN;
  opt_dir o_;
  
  ak_toolbox::compact_optional_ns::
  compact_optional<ak_toolbox::compact_optional_ns::evp_enum<Dir,_-1>,_ak_toolbox::compact_optional_ns::default_tag>
  ::compact_optional(&local_c);
  local_14 = N;
  ak_toolbox::compact_optional_ns::
  compact_optional<ak_toolbox::compact_optional_ns::evp_enum<Dir,_-1>,_ak_toolbox::compact_optional_ns::default_tag>
  ::compact_optional(&local_10,&local_14);
  local_2c = W;
  ak_toolbox::compact_optional_ns::
  compact_optional<ak_toolbox::compact_optional_ns::evp_enum<Dir,_-1>,_ak_toolbox::compact_optional_ns::default_tag>
  ::compact_optional(local_28,&local_2c);
  bVar1 = ak_toolbox::compact_optional_ns::detail_::
          compact_optional_base<ak_toolbox::compact_optional_ns::evp_enum<Dir,_-1>_>::has_value
                    (&local_c.
                      super_compact_optional_base<ak_toolbox::compact_optional_ns::evp_enum<Dir,__1>_>
                    );
  if (((bVar1 ^ 0xffU) & 1) == 0) {
    __assert_fail("!o_.has_value()",
                  "/workspace/llm4binary/github/license_c_cmakelists/akrzemi1[P]compact_optional/test_compact_optional.cpp"
                  ,0x146,"void test_evp_enum()");
  }
  bVar1 = ak_toolbox::compact_optional_ns::detail_::
          compact_optional_base<ak_toolbox::compact_optional_ns::evp_enum<Dir,_-1>_>::has_value
                    (&local_10.
                      super_compact_optional_base<ak_toolbox::compact_optional_ns::evp_enum<Dir,__1>_>
                    );
  if (!bVar1) {
    __assert_fail("oN.has_value()",
                  "/workspace/llm4binary/github/license_c_cmakelists/akrzemi1[P]compact_optional/test_compact_optional.cpp"
                  ,0x147,"void test_evp_enum()");
  }
  bVar1 = ak_toolbox::compact_optional_ns::detail_::
          compact_optional_base<ak_toolbox::compact_optional_ns::evp_enum<Dir,_-1>_>::has_value
                    (&local_28[0].
                      super_compact_optional_base<ak_toolbox::compact_optional_ns::evp_enum<Dir,__1>_>
                    );
  if (!bVar1) {
    __assert_fail("oW.has_value()",
                  "/workspace/llm4binary/github/license_c_cmakelists/akrzemi1[P]compact_optional/test_compact_optional.cpp"
                  ,0x148,"void test_evp_enum()");
  }
  pDVar2 = ak_toolbox::compact_optional_ns::detail_::
           compact_optional_base<ak_toolbox::compact_optional_ns::evp_enum<Dir,_-1>_>::value
                     (&local_10.
                       super_compact_optional_base<ak_toolbox::compact_optional_ns::evp_enum<Dir,__1>_>
                     );
  if (*pDVar2 != N) {
    __assert_fail("oN.value() == Dir::N",
                  "/workspace/llm4binary/github/license_c_cmakelists/akrzemi1[P]compact_optional/test_compact_optional.cpp"
                  ,0x14a,"void test_evp_enum()");
  }
  pDVar2 = ak_toolbox::compact_optional_ns::detail_::
           compact_optional_base<ak_toolbox::compact_optional_ns::evp_enum<Dir,_-1>_>::value
                     (&local_28[0].
                       super_compact_optional_base<ak_toolbox::compact_optional_ns::evp_enum<Dir,__1>_>
                     );
  if (*pDVar2 != W) {
    __assert_fail("oW.value() == Dir::W",
                  "/workspace/llm4binary/github/license_c_cmakelists/akrzemi1[P]compact_optional/test_compact_optional.cpp"
                  ,0x14b,"void test_evp_enum()");
  }
  psVar3 = ak_toolbox::compact_optional_ns::detail_::
           compact_optional_base<ak_toolbox::compact_optional_ns::evp_enum<Dir,_-1>_>::
           unsafe_raw_value(&local_c.
                             super_compact_optional_base<ak_toolbox::compact_optional_ns::evp_enum<Dir,__1>_>
                           );
  if (*psVar3 != -1) {
    __assert_fail("o_.unsafe_raw_value() == -1",
                  "/workspace/llm4binary/github/license_c_cmakelists/akrzemi1[P]compact_optional/test_compact_optional.cpp"
                  ,0x14d,"void test_evp_enum()");
  }
  psVar3 = ak_toolbox::compact_optional_ns::detail_::
           compact_optional_base<ak_toolbox::compact_optional_ns::evp_enum<Dir,_-1>_>::
           unsafe_raw_value(&local_10.
                             super_compact_optional_base<ak_toolbox::compact_optional_ns::evp_enum<Dir,__1>_>
                           );
  if (*psVar3 != 0) {
    __assert_fail("oN.unsafe_raw_value() == 0",
                  "/workspace/llm4binary/github/license_c_cmakelists/akrzemi1[P]compact_optional/test_compact_optional.cpp"
                  ,0x14e,"void test_evp_enum()");
  }
  psVar3 = ak_toolbox::compact_optional_ns::detail_::
           compact_optional_base<ak_toolbox::compact_optional_ns::evp_enum<Dir,_-1>_>::
           unsafe_raw_value(&local_28[0].
                             super_compact_optional_base<ak_toolbox::compact_optional_ns::evp_enum<Dir,__1>_>
                           );
  if (*psVar3 == 3) {
    ak_toolbox::compact_optional_ns::
    compact_optional<ak_toolbox::compact_optional_ns::evp_enum<Dir,_-1>,_ak_toolbox::compact_optional_ns::default_tag>
    ::~compact_optional(local_28);
    ak_toolbox::compact_optional_ns::
    compact_optional<ak_toolbox::compact_optional_ns::evp_enum<Dir,_-1>,_ak_toolbox::compact_optional_ns::default_tag>
    ::~compact_optional(&local_10);
    ak_toolbox::compact_optional_ns::
    compact_optional<ak_toolbox::compact_optional_ns::evp_enum<Dir,_-1>,_ak_toolbox::compact_optional_ns::default_tag>
    ::~compact_optional(&local_c);
    return;
  }
  __assert_fail("oW.unsafe_raw_value() == 3",
                "/workspace/llm4binary/github/license_c_cmakelists/akrzemi1[P]compact_optional/test_compact_optional.cpp"
                ,0x14f,"void test_evp_enum()");
}

Assistant:

void test_evp_enum()
{
  typedef compact_optional<evp_enum<Dir, -1>> opt_dir;
  opt_dir o_, oN(Dir::N), oW(Dir::W);
  
  assert (!o_.has_value());
  assert ( oN.has_value());
  assert ( oW.has_value());
  
  assert (oN.value() == Dir::N);
  assert (oW.value() == Dir::W);
  
  assert (o_.unsafe_raw_value() == -1);
  assert (oN.unsafe_raw_value() ==  0);
  assert (oW.unsafe_raw_value() ==  3);
}